

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_Subscription * UA_Subscription_new(UA_Session *session,UA_UInt32 subscriptionID)

{
  UA_Subscription *pUVar1;
  
  pUVar1 = (UA_Subscription *)malloc(0x80);
  if (pUVar1 != (UA_Subscription *)0x0) {
    pUVar1->session = session;
    pUVar1->subscriptionID = subscriptionID;
    pUVar1->maxKeepAliveCount = 0;
    pUVar1->publishingEnabled = false;
    pUVar1->state = UA_SUBSCRIPTIONSTATE_NORMAL;
    pUVar1->sequenceNumber = 0;
    pUVar1->currentKeepAliveCount = 0;
    pUVar1->currentLifetimeCount = 0;
    pUVar1->lastMonitoredItemId = 0;
    (pUVar1->publishJobGuid).data1 = 0;
    (pUVar1->publishJobGuid).data2 = 0;
    (pUVar1->publishJobGuid).data3 = 0;
    (pUVar1->publishJobGuid).data4[0] = '\0';
    (pUVar1->publishJobGuid).data4[1] = '\0';
    (pUVar1->publishJobGuid).data4[2] = '\0';
    (pUVar1->publishJobGuid).data4[3] = '\0';
    *(undefined8 *)((pUVar1->publishJobGuid).data4 + 1) = 0;
    (pUVar1->monitoredItems).lh_first = (UA_MonitoredItem *)0x0;
    (pUVar1->retransmissionQueue).tqh_first = (UA_NotificationMessageEntry *)0x0;
    (pUVar1->retransmissionQueue).tqh_last = &(pUVar1->retransmissionQueue).tqh_first;
    pUVar1->retransmissionQueueSize = 0;
  }
  return pUVar1;
}

Assistant:

UA_Subscription * UA_Subscription_new(UA_Session *session, UA_UInt32 subscriptionID) {
    UA_Subscription *new = UA_malloc(sizeof(UA_Subscription));
    if(!new)
        return NULL;
    new->session = session;
    new->subscriptionID = subscriptionID;
    new->sequenceNumber = 0;
    new->maxKeepAliveCount = 0;
    new->publishingEnabled = false;
    memset(&new->publishJobGuid, 0, sizeof(UA_Guid));
    new->publishJobIsRegistered = false;
    new->currentKeepAliveCount = 0;
    new->currentLifetimeCount = 0;
    new->lastMonitoredItemId = 0;
    new->state = UA_SUBSCRIPTIONSTATE_NORMAL; /* The first publish response is sent immediately */
    LIST_INIT(&new->monitoredItems);
    TAILQ_INIT(&new->retransmissionQueue);
    new->retransmissionQueueSize = 0;
    return new;
}